

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_log.cpp
# Opt level: O2

int main(void)

{
  char cVar1;
  bool bVar2;
  level_type lVar3;
  my_sink *__p;
  shared_ptr *psVar4;
  ostream *poVar5;
  char *pcVar6;
  weak_ptr *pwVar7;
  file *this;
  long lVar8;
  runtime_error *prVar9;
  shared_ptr<booster::log::sink> s;
  ifstream ifs;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_408 [3];
  int aiStack_3f0 [122];
  string line;
  shared_ptr<booster::log::sinks::file> f;
  string local_1d8 [32];
  ostringstream oss_24;
  string local_40 [32];
  
  __p = (my_sink *)operator_new(8);
  (__p->super_sink)._vptr_sink = (_func_int **)&PTR_log_00109c10;
  std::__shared_ptr<booster::log::sink,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<my_sink,void>
            ((__shared_ptr<booster::log::sink,(__gnu_cxx::_Lock_policy)2> *)&s,__p);
  psVar4 = (shared_ptr *)booster::log::logger::instance();
  booster::log::logger::add_sink(psVar4);
  reset();
  lVar3 = booster::log::logger::instance();
  cVar1 = booster::log::logger::should_be_logged(lVar3,(char *)0x0);
  if (cVar1 != '\0') {
    booster::log::message::message
              ((message *)&ifs,emergency,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x2b);
    poVar5 = (ostream *)booster::log::message::out();
    std::operator<<(poVar5,"Test");
    booster::log::message::~message((message *)&ifs);
  }
  if (called == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    poVar5 = std::operator<<((ostream *)&ifs,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x2c);
    std::operator<<(poVar5," called");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&oss_24);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar2 = std::operator==(&last_message_abi_cxx11_,"Test");
  pcVar6 = last_module;
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    poVar5 = std::operator<<((ostream *)&ifs,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x2d);
    std::operator<<(poVar5," last_message == \"Test\"");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&oss_24);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&ifs,"test",(allocator *)&oss_24);
  bVar2 = std::operator==(pcVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&ifs);
  std::__cxx11::string::~string((string *)&ifs);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    poVar5 = std::operator<<((ostream *)&ifs,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x2e);
    std::operator<<(poVar5," last_module==std::string(\"test\")");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&oss_24);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (last_level != emergency) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    poVar5 = std::operator<<((ostream *)&ifs,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x2f);
    std::operator<<(poVar5," last_level ==bl::emergency");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&oss_24);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  reset();
  lVar3 = booster::log::logger::instance();
  cVar1 = booster::log::logger::should_be_logged(lVar3,(char *)0xa);
  if (cVar1 != '\0') {
    booster::log::message::message
              ((message *)&ifs,alert,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x31);
    poVar5 = (ostream *)booster::log::message::out();
    std::operator<<(poVar5,"x");
    booster::log::message::~message((message *)&ifs);
  }
  if (called == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    poVar5 = std::operator<<((ostream *)&ifs,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x32);
    std::operator<<(poVar5," called");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&oss_24);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (last_level != alert) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    poVar5 = std::operator<<((ostream *)&ifs,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x33);
    std::operator<<(poVar5," last_level==bl::alert");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&oss_24);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  reset();
  lVar3 = booster::log::logger::instance();
  cVar1 = booster::log::logger::should_be_logged(lVar3,(char *)0x1e);
  if (cVar1 != '\0') {
    booster::log::message::message
              ((message *)&ifs,error,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x35);
    poVar5 = (ostream *)booster::log::message::out();
    std::operator<<(poVar5,"x");
    booster::log::message::~message((message *)&ifs);
  }
  if (called == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    poVar5 = std::operator<<((ostream *)&ifs,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x36);
    std::operator<<(poVar5," called");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&oss_24);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (last_level != error) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    poVar5 = std::operator<<((ostream *)&ifs,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x37);
    std::operator<<(poVar5," last_level==bl::error");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&oss_24);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  reset();
  lVar3 = booster::log::logger::instance();
  cVar1 = booster::log::logger::should_be_logged(lVar3,(char *)0x28);
  if (cVar1 != '\0') {
    booster::log::message::message
              ((message *)&ifs,warning,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x39);
    poVar5 = (ostream *)booster::log::message::out();
    std::operator<<(poVar5,"x");
    booster::log::message::~message((message *)&ifs);
  }
  if (called != false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    poVar5 = std::operator<<((ostream *)&ifs,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x3a);
    std::operator<<(poVar5," !called");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&oss_24);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  reset();
  lVar3 = booster::log::logger::instance();
  cVar1 = booster::log::logger::should_be_logged(lVar3,(char *)0x32);
  if (cVar1 != '\0') {
    booster::log::message::message
              ((message *)&ifs,notice,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x3c);
    poVar5 = (ostream *)booster::log::message::out();
    std::operator<<(poVar5,"x");
    booster::log::message::~message((message *)&ifs);
  }
  if (called != false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    poVar5 = std::operator<<((ostream *)&ifs,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x3d);
    std::operator<<(poVar5," !called");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&oss_24);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  reset();
  lVar3 = booster::log::logger::instance();
  cVar1 = booster::log::logger::should_be_logged(lVar3,(char *)0x46);
  if (cVar1 != '\0') {
    booster::log::message::message
              ((message *)&ifs,debug,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x3f);
    poVar5 = (ostream *)booster::log::message::out();
    std::operator<<(poVar5,"x");
    booster::log::message::~message((message *)&ifs);
  }
  if (called != false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    poVar5 = std::operator<<((ostream *)&ifs,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x40);
    std::operator<<(poVar5," !called");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&oss_24);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  reset();
  lVar3 = booster::log::logger::instance();
  booster::log::logger::set_default_level(lVar3);
  lVar3 = booster::log::logger::instance();
  cVar1 = booster::log::logger::should_be_logged(lVar3,(char *)0x32);
  if (cVar1 != '\0') {
    booster::log::message::message
              ((message *)&ifs,notice,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x43);
    poVar5 = (ostream *)booster::log::message::out();
    std::operator<<(poVar5,"x");
    booster::log::message::~message((message *)&ifs);
  }
  if (called == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    poVar5 = std::operator<<((ostream *)&ifs,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x44);
    std::operator<<(poVar5," called");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&oss_24);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  reset();
  lVar3 = booster::log::logger::instance();
  cVar1 = booster::log::logger::should_be_logged(lVar3,(char *)0x3c);
  if (cVar1 != '\0') {
    booster::log::message::message
              ((message *)&ifs,info,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x46);
    poVar5 = (ostream *)booster::log::message::out();
    std::operator<<(poVar5,"x");
    booster::log::message::~message((message *)&ifs);
  }
  if (called != false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    poVar5 = std::operator<<((ostream *)&ifs,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x47);
    std::operator<<(poVar5," !called");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&oss_24);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  reset();
  lVar3 = booster::log::logger::instance();
  booster::log::logger::set_log_level(lVar3,(char *)0x1e);
  lVar3 = booster::log::logger::instance();
  cVar1 = booster::log::logger::should_be_logged(lVar3,(char *)0x1e);
  if (cVar1 != '\0') {
    booster::log::message::message
              ((message *)&ifs,error,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x4a);
    poVar5 = (ostream *)booster::log::message::out();
    std::operator<<(poVar5,"x");
    booster::log::message::~message((message *)&ifs);
  }
  if (called == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    poVar5 = std::operator<<((ostream *)&ifs,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x4b);
    std::operator<<(poVar5," called");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&oss_24);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  reset();
  lVar3 = booster::log::logger::instance();
  cVar1 = booster::log::logger::should_be_logged(lVar3,(char *)0x28);
  if (cVar1 != '\0') {
    booster::log::message::message
              ((message *)&ifs,warning,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x4d);
    poVar5 = (ostream *)booster::log::message::out();
    std::operator<<(poVar5,"x");
    booster::log::message::~message((message *)&ifs);
  }
  if (called != false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    poVar5 = std::operator<<((ostream *)&ifs,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x4e);
    std::operator<<(poVar5," !called");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&oss_24);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  reset();
  lVar3 = booster::log::logger::instance();
  booster::log::logger::set_log_level(lVar3,(char *)0x28);
  lVar3 = booster::log::logger::instance();
  cVar1 = booster::log::logger::should_be_logged(lVar3,(char *)0x28);
  if (cVar1 != '\0') {
    booster::log::message::message
              ((message *)&ifs,warning,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x51);
    poVar5 = (ostream *)booster::log::message::out();
    std::operator<<(poVar5,"x");
    booster::log::message::~message((message *)&ifs);
  }
  if (called == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    poVar5 = std::operator<<((ostream *)&ifs,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x52);
    std::operator<<(poVar5," called");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&oss_24);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  reset();
  lVar3 = booster::log::logger::instance();
  cVar1 = booster::log::logger::should_be_logged(lVar3,(char *)0x32);
  if (cVar1 != '\0') {
    booster::log::message::message
              ((message *)&ifs,notice,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x54);
    poVar5 = (ostream *)booster::log::message::out();
    std::operator<<(poVar5,"x");
    booster::log::message::~message((message *)&ifs);
  }
  if (called != false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    poVar5 = std::operator<<((ostream *)&ifs,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x55);
    std::operator<<(poVar5," !called");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&oss_24);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  reset();
  pcVar6 = (char *)booster::log::logger::instance();
  booster::log::logger::reset_log_level(pcVar6);
  lVar3 = booster::log::logger::instance();
  cVar1 = booster::log::logger::should_be_logged(lVar3,(char *)0x32);
  if (cVar1 != '\0') {
    booster::log::message::message
              ((message *)&ifs,notice,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x58);
    poVar5 = (ostream *)booster::log::message::out();
    std::operator<<(poVar5,"x");
    booster::log::message::~message((message *)&ifs);
  }
  if (called == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    poVar5 = std::operator<<((ostream *)&ifs,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x59);
    std::operator<<(poVar5," called");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&oss_24);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  reset();
  lVar3 = booster::log::logger::instance();
  cVar1 = booster::log::logger::should_be_logged(lVar3,(char *)0x3c);
  if (cVar1 != '\0') {
    booster::log::message::message
              ((message *)&ifs,info,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x5b);
    poVar5 = (ostream *)booster::log::message::out();
    std::operator<<(poVar5,"x");
    booster::log::message::~message((message *)&ifs);
  }
  if (called == false) {
    reset();
    lVar3 = booster::log::logger::instance();
    cVar1 = booster::log::logger::should_be_logged(lVar3,(char *)0x3c);
    if (cVar1 != '\0') {
      booster::log::message::message
                ((message *)&ifs,info,"test",
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                 ,0x5e);
      poVar5 = (ostream *)booster::log::message::out();
      never_called_called = true;
      std::ostream::operator<<(poVar5,10);
      booster::log::message::~message((message *)&ifs);
    }
    if (called != false) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      poVar5 = std::operator<<((ostream *)&ifs,"Error ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x5f);
      std::operator<<(poVar5," !called");
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar9,(string *)&oss_24);
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (never_called_called == true) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      poVar5 = std::operator<<((ostream *)&ifs,"Error ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x60);
      std::operator<<(poVar5," !never_called_called");
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar9,(string *)&oss_24);
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    reset();
    pwVar7 = (weak_ptr *)booster::log::logger::instance();
    std::__weak_ptr<booster::log::sink,(__gnu_cxx::_Lock_policy)2>::
    __weak_ptr<booster::log::sink,void>
              ((__weak_ptr<booster::log::sink,(__gnu_cxx::_Lock_policy)2> *)&ifs,
               &s.super___shared_ptr<booster::log::sink,_(__gnu_cxx::_Lock_policy)2>);
    booster::log::logger::remove_sink(pwVar7);
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(local_408);
    lVar3 = booster::log::logger::instance();
    cVar1 = booster::log::logger::should_be_logged(lVar3,(char *)0x1e);
    if (cVar1 != '\0') {
      booster::log::message::message
                ((message *)&ifs,error,"test",
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                 ,99);
      poVar5 = (ostream *)booster::log::message::out();
      std::operator<<(poVar5,"message");
      booster::log::message::~message((message *)&ifs);
    }
    if (called != false) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      poVar5 = std::operator<<((ostream *)&ifs,"Error ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,100);
      std::operator<<(poVar5," !called");
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar9,(string *)&oss_24);
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    reset();
    psVar4 = (shared_ptr *)booster::log::logger::instance();
    booster::log::logger::add_sink(psVar4);
    lVar3 = booster::log::logger::instance();
    cVar1 = booster::log::logger::should_be_logged(lVar3,(char *)0x1e);
    if (cVar1 != '\0') {
      booster::log::message::message
                ((message *)&ifs,error,"test",
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                 ,0x67);
      poVar5 = (ostream *)booster::log::message::out();
      std::operator<<(poVar5,"message");
      booster::log::message::~message((message *)&ifs);
    }
    if (called == false) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      poVar5 = std::operator<<((ostream *)&ifs,"Error ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x68);
      std::operator<<(poVar5," called");
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar9,(string *)&oss_24);
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    reset();
    booster::log::logger::instance();
    booster::log::logger::remove_all_sinks();
    lVar3 = booster::log::logger::instance();
    cVar1 = booster::log::logger::should_be_logged(lVar3,(char *)0x1e);
    if (cVar1 != '\0') {
      booster::log::message::message
                ((message *)&ifs,error,"test",
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                 ,0x6b);
      poVar5 = (ostream *)booster::log::message::out();
      std::operator<<(poVar5,"message");
      booster::log::message::~message((message *)&ifs);
    }
    if (called == false) {
      reset();
      this = (file *)operator_new(0x30);
      booster::log::sinks::file::file(this);
      std::__shared_ptr<booster::log::sinks::file,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<booster::log::sinks::file,void>
                ((__shared_ptr<booster::log::sinks::file,(__gnu_cxx::_Lock_policy)2> *)&f,this);
      std::__cxx11::string::string(local_40,"test.log",(allocator *)&ifs);
      booster::log::sinks::file::open
                (f.super___shared_ptr<booster::log::sinks::file,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 local_40);
      std::__cxx11::string::~string(local_40);
      psVar4 = (shared_ptr *)booster::log::logger::instance();
      std::__shared_ptr<booster::log::sink,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<booster::log::sinks::file,void>
                ((__shared_ptr<booster::log::sink,(__gnu_cxx::_Lock_policy)2> *)&ifs,
                 &f.super___shared_ptr<booster::log::sinks::file,_(__gnu_cxx::_Lock_policy)2>);
      booster::log::logger::add_sink(psVar4);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_408);
      lVar3 = booster::log::logger::instance();
      cVar1 = booster::log::logger::should_be_logged(lVar3,(char *)0x1e);
      if (cVar1 != '\0') {
        booster::log::message::message
                  ((message *)&ifs,error,"module",
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                   ,0x72);
        poVar5 = (ostream *)booster::log::message::out();
        std::operator<<(poVar5,"Message ");
        std::ostream::_M_insert<double>(3.14159);
        booster::log::message::~message((message *)&ifs);
      }
      std::ifstream::ifstream(&ifs,"test.log",_S_in);
      if (*(int *)((long)aiStack_3f0 + *(long *)(_ifs + -0x18)) != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_24);
        poVar5 = std::operator<<((ostream *)&oss_24,"Error ");
        poVar5 = std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                                );
        poVar5 = std::operator<<(poVar5,":");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x74);
        std::operator<<(poVar5," ifs.good()");
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar9,(string *)&line);
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      line._M_dataplus._M_p = (pointer)&line.field_2;
      line._M_string_length = 0;
      line.field_2._M_local_buf[0] = '\0';
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&ifs,(string *)&line);
      lVar8 = std::__cxx11::string::find((char *)&line,0x10715b);
      if (lVar8 == -1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_24);
        poVar5 = std::operator<<((ostream *)&oss_24,"Error ");
        poVar5 = std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                                );
        poVar5 = std::operator<<(poVar5,":");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x77);
        std::operator<<(poVar5," line.find(\"Message \")!=std::string::npos");
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar9,local_1d8);
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      lVar8 = std::__cxx11::string::find((char *)&line,0x107154);
      if (lVar8 != -1) {
        lVar8 = std::__cxx11::string::find((char *)&line,0x1071c2);
        if (lVar8 != -1) {
          std::__cxx11::string::~string((string *)&line);
          std::ifstream::~ifstream(&ifs);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&f.super___shared_ptr<booster::log::sinks::file,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&s.super___shared_ptr<booster::log::sink,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          poVar5 = std::operator<<((ostream *)&std::cout,"Ok");
          std::endl<char,std::char_traits<char>>(poVar5);
          return 0;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_24);
        poVar5 = std::operator<<((ostream *)&oss_24,"Error ");
        poVar5 = std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                                );
        poVar5 = std::operator<<(poVar5,":");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x79);
        std::operator<<(poVar5," line.find(\"3.14159\")!=std::string::npos");
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar9,local_1d8);
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_24);
      poVar5 = std::operator<<((ostream *)&oss_24,"Error ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x78);
      std::operator<<(poVar5," line.find(\"module\")!=std::string::npos");
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar9,local_1d8);
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    poVar5 = std::operator<<((ostream *)&ifs,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x6c);
    std::operator<<(poVar5," !called");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&oss_24);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
  poVar5 = std::operator<<((ostream *)&ifs,"Error ");
  poVar5 = std::operator<<(poVar5,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                          );
  poVar5 = std::operator<<(poVar5,":");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x5c);
  std::operator<<(poVar5," !called");
  prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar9,(string *)&oss_24);
  __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main()
{
	try {
		namespace bl = booster::log;
		booster::shared_ptr<bl::sink> s(new my_sink);
		bl::logger::instance().add_sink(s);
		reset();
		BOOSTER_EMERG("test") << "Test";
		TEST(called);
		TEST(last_message == "Test");
		TEST(last_module==std::string("test"));
		TEST(last_level ==bl::emergency);
		reset();
		BOOSTER_ALERT("test") << "x";
		TEST(called);
		TEST(last_level==bl::alert);
		reset();
		BOOSTER_ERROR("test") << "x";
		TEST(called);
		TEST(last_level==bl::error);
		reset();
		BOOSTER_WARNING("test") << "x";
		TEST(!called);
		reset();
		BOOSTER_NOTICE("test") << "x";
		TEST(!called);
		reset();
		BOOSTER_DEBUG("test") << "x";
		TEST(!called);
		reset();
		bl::logger::instance().set_default_level(bl::notice);
		BOOSTER_NOTICE("test") << "x";
		TEST(called);
		reset();
		BOOSTER_INFO("test") << "x";
		TEST(!called);
		reset();
		bl::logger::instance().set_log_level(bl::error,"test");
		BOOSTER_ERROR("test") << "x";
		TEST(called);
		reset();
		BOOSTER_WARNING("test") << "x";
		TEST(!called);
		reset();
		bl::logger::instance().set_log_level(bl::warning,"test");
		BOOSTER_WARNING("test") << "x";
		TEST(called);
		reset();
		BOOSTER_NOTICE("test") << "x";
		TEST(!called);
		reset();
		bl::logger::instance().reset_log_level("test");
		BOOSTER_NOTICE("test") << "x";
		TEST(called);
		reset();
		BOOSTER_INFO("test") << "x";
		TEST(!called);
		reset();
		BOOSTER_INFO("test") << never_called();
		TEST(!called);
		TEST(!never_called_called);
		reset();
		bl::logger::instance().remove_sink(s);
		BOOSTER_ERROR("test") << "message";
		TEST(!called);
		reset();
		bl::logger::instance().add_sink(s);
		BOOSTER_ERROR("test") << "message";
		TEST(called);
		reset();
		bl::logger::instance().remove_all_sinks();
		BOOSTER_ERROR("test") << "message";
		TEST(!called);
		reset();

		booster::shared_ptr<bl::sinks::file> f(new bl::sinks::file());
		f->open("test.log");
		bl::logger::instance().add_sink(f);
		BOOSTER_ERROR("module") << "Message " << 3.14159;
		std::ifstream ifs("test.log");
		TEST(ifs.good());
		std::string line;
		std::getline(ifs,line);
		TEST(line.find("Message ")!=std::string::npos);
		TEST(line.find("module")!=std::string::npos);
		TEST(line.find("3.14159")!=std::string::npos);
	}
	catch(std::exception const &e)
	{
		std::cerr << "Fail: " <<e.what() << std::endl;
		return 1;
	}
	
	std::cout << "Ok" << std::endl;

	return 0;
}